

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

btScalar btSoftBody::RayFromToCaster::rayFromToTriangle
                   (btVector3 *rayFrom,btVector3 *rayTo,btVector3 *rayNormalizedDirection,
                   btVector3 *a,btVector3 *b,btVector3 *c,btScalar maxt)

{
  bool bVar1;
  btVector3 *in_RDI;
  float in_XMM0_Da;
  btScalar bVar2;
  btVector3 hit;
  btScalar t;
  btScalar num;
  btScalar den;
  btScalar d;
  btVector3 n;
  btVector3 *in_stack_fffffffffffffea8;
  btVector3 *in_stack_fffffffffffffeb0;
  btVector3 *v1;
  btVector3 *in_stack_fffffffffffffeb8;
  btVector3 *v2;
  btVector3 *in_stack_fffffffffffffec0;
  btVector3 local_8c;
  float local_7c;
  float local_78;
  btScalar local_74;
  btScalar local_70;
  btScalar local_6c [4];
  btScalar local_5c [4];
  btScalar local_4c [4];
  float local_3c;
  btVector3 *local_10;
  
  local_3c = in_XMM0_Da;
  local_10 = in_RDI;
  local_5c = (btScalar  [4])operator-(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_6c = (btScalar  [4])operator-(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_4c = (btScalar  [4])btCross(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  local_70 = btDot(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  local_74 = btDot(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  bVar1 = btFuzzyZero(0.0);
  if (!bVar1) {
    bVar2 = btDot(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    local_78 = bVar2 - local_70;
    local_7c = -local_78 / local_74;
    if ((1.1920929e-06 < local_7c) && (local_7c < local_3c)) {
      ::operator*(local_10,in_stack_fffffffffffffeb8->m_floats);
      local_8c = operator+(local_10,in_stack_fffffffffffffeb8);
      operator-(local_10,in_stack_fffffffffffffeb8);
      operator-(local_10,in_stack_fffffffffffffeb8);
      btCross(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      bVar2 = btDot(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      bVar1 = false;
      if (-1.1920929e-06 < bVar2) {
        v2 = &local_8c;
        operator-(local_10,v2);
        operator-(local_10,v2);
        btCross(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        bVar2 = btDot(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        bVar1 = false;
        if (-1.1920929e-06 < bVar2) {
          v1 = &local_8c;
          operator-(local_10,v2);
          operator-(local_10,v2);
          btCross(v1,in_stack_fffffffffffffea8);
          bVar2 = btDot(v1,in_stack_fffffffffffffea8);
          bVar1 = -1.1920929e-06 < bVar2;
        }
      }
      if (bVar1) {
        return local_7c;
      }
    }
  }
  return -1.0;
}

Assistant:

btScalar			btSoftBody::RayFromToCaster::rayFromToTriangle(	const btVector3& rayFrom,
																   const btVector3& rayTo,
																   const btVector3& rayNormalizedDirection,
																   const btVector3& a,
																   const btVector3& b,
																   const btVector3& c,
																   btScalar maxt)
{
	static const btScalar	ceps=-SIMD_EPSILON*10;
	static const btScalar	teps=SIMD_EPSILON*10;

	const btVector3			n=btCross(b-a,c-a);
	const btScalar			d=btDot(a,n);
	const btScalar			den=btDot(rayNormalizedDirection,n);
	if(!btFuzzyZero(den))
	{
		const btScalar		num=btDot(rayFrom,n)-d;
		const btScalar		t=-num/den;
		if((t>teps)&&(t<maxt))
		{
			const btVector3	hit=rayFrom+rayNormalizedDirection*t;
			if(	(btDot(n,btCross(a-hit,b-hit))>ceps)	&&			
				(btDot(n,btCross(b-hit,c-hit))>ceps)	&&
				(btDot(n,btCross(c-hit,a-hit))>ceps))
			{
				return(t);
			}
		}
	}
	return(-1);
}